

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::GatherBase::TextBody_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string str_if;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (**(code **)(*this + 0x100))(&local_160);
  std::operator+(&local_180,"    if (all(lessThanEqual(abs(tmp - ",&local_160);
  std::operator+(&str_if,&local_180,"), vec4(0.039)))) {           \n");
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  (**(code **)(*this + 0xb8))(&local_180,this);
  lVar1 = std::__cxx11::string::find((char)&local_180,0x75);
  if (lVar1 == -1) {
    (**(code **)(*this + 0xb8))(&local_160,this);
    lVar1 = std::__cxx11::string::find((char)&local_160,0x69);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    if (lVar1 == -1) goto LAB_00c0ae10;
  }
  else {
    std::__cxx11::string::~string((string *)&local_180);
  }
  (**(code **)(*this + 0x100))(&local_140,this);
  std::operator+(&local_160,"    if (tmp == ",&local_140);
  std::operator+(&local_180,&local_160,") {           \n");
  std::__cxx11::string::operator=((string *)&str_if,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
LAB_00c0ae10:
  (**(code **)(*this + 0xd0))(&local_c0,this);
  std::operator+(&local_a0,
                 "vec4 test_function(vec4 p) {                                                                         \n"
                 ,&local_c0);
  std::operator+(&local_80,&local_a0,"    mediump ");
  (**(code **)(*this + 0xb8))(&local_e0,this);
  std::operator+(&local_60,&local_80,&local_e0);
  std::operator+(&local_40,&local_60," tmp = ");
  (**(code **)(*this + 200))(&local_100,this);
  std::operator+(&local_140,&local_40,&local_100);
  std::operator+(&local_160,&local_140,";                                                   \n");
  std::operator+(&local_180,&local_160,&str_if);
  std::operator+(__return_storage_ptr__,&local_180,
                 "        return vec4(0.0, 1.0, 0.0, 1.0);                                                             \n    } else {                                                                                         \n        return vec4(float(tmp.x), float(tmp.y), float(tmp.z), float(tmp.w));                         \n    }                                                                                                \n}\n"
                );
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&str_if);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string TextBody()
	{
		std::string str_if = "    if (all(lessThanEqual(abs(tmp - " + Expected() + "), vec4(0.039)))) {           \n";
		if (Type().find('u') != std::string::npos || Type().find('i') != std::string::npos)
		{
			str_if = "    if (tmp == " + Expected() + ") {           \n";
		}
		return "vec4 test_function(vec4 p) {                                                                         "
			   "\n" +
			   Offset() + "    mediump " + Type() + " tmp = " + Gather() +
			   ";                                                   \n" + str_if +
			   "        return vec4(0.0, 1.0, 0.0, 1.0);                                                             \n"
			   "    } else {                                                                                         \n"
			   "        return vec4(float(tmp.x), float(tmp.y), float(tmp.z), float(tmp.w));                         \n"
			   "    }                                                                                                \n"
			   "}\n";
	}